

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::GetSteeringData
          (Error *__return_storage_ptr__,CommissionerApp *this,ByteArray *aSteeringData,
          JoinerType aJoinerType)

{
  uint uVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  anon_class_1_0_00000001 local_462;
  v10 local_461;
  v10 *local_460;
  size_t local_458;
  string local_450;
  Error local_430;
  anon_class_1_0_00000001 local_402;
  v10 local_401;
  v10 *local_400;
  size_t local_3f8;
  string local_3f0;
  Error local_3d0;
  anon_class_1_0_00000001 local_3a2;
  v10 local_3a1;
  v10 *local_3a0;
  size_t local_398;
  string local_390;
  Error local_370;
  anon_class_1_0_00000001 local_342;
  v10 local_341;
  v10 *local_340;
  size_t local_338;
  string local_330;
  Error local_310;
  undefined1 local_2d5;
  JoinerType local_2d4;
  ByteArray *pBStack_2d0;
  JoinerType aJoinerType_local;
  ByteArray *aSteeringData_local;
  CommissionerApp *this_local;
  Error *error;
  undefined1 local_2a0 [16];
  v10 *local_290;
  ulong local_288;
  v10 *local_280;
  size_t sStack_278;
  string *local_270;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_268 [3];
  undefined1 local_250 [16];
  v10 *local_240;
  ulong local_238;
  v10 *local_230;
  size_t sStack_228;
  string *local_220;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_218 [3];
  undefined1 local_200 [16];
  v10 *local_1f0;
  ulong local_1e8;
  v10 *local_1e0;
  size_t sStack_1d8;
  string *local_1d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *local_1c8 [2];
  undefined1 local_1b8 [16];
  v10 *local_1a8;
  ulong local_1a0;
  v10 *local_198;
  size_t sStack_190;
  string *local_188;
  v10 *local_180;
  v10 **local_178;
  v10 *local_170;
  v10 **local_168;
  v10 *local_160;
  v10 **local_158;
  v10 *local_150;
  v10 **local_148;
  v10 **local_140;
  v10 *local_138;
  size_t sStack_130;
  v10 **local_120;
  v10 *local_118;
  size_t sStack_110;
  v10 **local_100;
  v10 *local_f8;
  size_t sStack_f0;
  v10 **local_e0;
  v10 *local_d8;
  size_t sStack_d0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_c8;
  undefined1 *local_c0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_b8;
  undefined1 *local_b0;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_a8;
  undefined1 *local_a0;
  Error **local_98;
  undefined1 *local_90;
  Error **local_88;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_80;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_78;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_70;
  Error **local_68;
  undefined8 local_60;
  undefined1 *local_58;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_50;
  undefined8 local_48;
  undefined1 *local_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_38;
  undefined8 local_30;
  undefined1 *local_28;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> **local_20;
  undefined8 local_18;
  undefined1 *local_10;
  
  local_2d5 = 0;
  local_2d4 = aJoinerType;
  pBStack_2d0 = aSteeringData;
  aSteeringData_local = (ByteArray *)this;
  this_local = (CommissionerApp *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  uVar1 = (*(this->super_CommissionerHandler)._vptr_CommissionerHandler[0xf])();
  if ((uVar1 & 1) == 0) {
    GetSteeringData::anon_class_1_0_00000001::operator()(&local_342);
    local_178 = &local_340;
    local_180 = &local_341;
    bVar2 = ::fmt::v10::operator()(local_180);
    local_338 = bVar2.size_;
    local_340 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
    local_188 = &local_330;
    local_198 = local_340;
    sStack_190 = local_338;
    local_140 = &local_198;
    local_1a8 = local_340;
    local_1a0 = local_338;
    local_138 = local_1a8;
    sStack_130 = local_1a0;
    local_1c8[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
    local_c0 = local_1b8;
    local_c8 = local_1c8;
    local_18 = 0;
    fmt.size_ = 0;
    fmt.data_ = (char *)local_1a0;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_c8;
    local_70 = local_c8;
    local_20 = local_c8;
    local_10 = local_c0;
    ::fmt::v10::vformat_abi_cxx11_(&local_330,local_1a8,fmt,args);
    Error::Error(&local_310,kInvalidState,&local_330);
    Error::operator=(__return_storage_ptr__,&local_310);
    Error::~Error(&local_310);
    std::__cxx11::string::~string((string *)&local_330);
  }
  else if (local_2d4 == kMeshCoP) {
    if (((this->mCommDataset).mPresentFlags & 0x2000) == 0) {
      GetSteeringData::anon_class_1_0_00000001::operator()(&local_3a2);
      local_168 = &local_3a0;
      local_170 = &local_3a1;
      bVar2 = ::fmt::v10::operator()(local_170);
      local_398 = bVar2.size_;
      local_3a0 = (v10 *)bVar2.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_1d0 = &local_390;
      local_1e0 = local_3a0;
      sStack_1d8 = local_398;
      local_120 = &local_1e0;
      local_1f0 = local_3a0;
      local_1e8 = local_398;
      local_118 = local_1f0;
      sStack_110 = local_1e8;
      local_218[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_b0 = local_200;
      local_b8 = local_218;
      local_30 = 0;
      fmt_00.size_ = 0;
      fmt_00.data_ = (char *)local_1e8;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_b8;
      local_78 = local_b8;
      local_38 = local_b8;
      local_28 = local_b0;
      ::fmt::v10::vformat_abi_cxx11_(&local_390,local_1f0,fmt_00,args_00);
      Error::Error(&local_370,kNotFound,&local_390);
      Error::operator=(__return_storage_ptr__,&local_370);
      Error::~Error(&local_370);
      std::__cxx11::string::~string((string *)&local_390);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (pBStack_2d0,&(this->mCommDataset).mSteeringData);
    }
  }
  else if (local_2d4 == kAE) {
    if (((this->mCommDataset).mPresentFlags & 0x1000) == 0) {
      GetSteeringData::anon_class_1_0_00000001::operator()(&local_402);
      local_158 = &local_400;
      local_160 = &local_401;
      bVar2 = ::fmt::v10::operator()(local_160);
      local_3f8 = bVar2.size_;
      local_400 = (v10 *)bVar2.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_220 = &local_3f0;
      local_230 = local_400;
      sStack_228 = local_3f8;
      local_100 = &local_230;
      local_240 = local_400;
      local_238 = local_3f8;
      local_f8 = local_240;
      sStack_f0 = local_238;
      local_268[0] = ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_a0 = local_250;
      local_a8 = local_268;
      local_48 = 0;
      fmt_01.size_ = 0;
      fmt_01.data_ = (char *)local_238;
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)local_a8;
      local_80 = local_a8;
      local_50 = local_a8;
      local_40 = local_a0;
      ::fmt::v10::vformat_abi_cxx11_(&local_3f0,local_240,fmt_01,args_01);
      Error::Error(&local_3d0,kNotFound,&local_3f0);
      Error::operator=(__return_storage_ptr__,&local_3d0);
      Error::~Error(&local_3d0);
      std::__cxx11::string::~string((string *)&local_3f0);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (pBStack_2d0,&(this->mCommDataset).mAeSteeringData);
    }
  }
  else if (local_2d4 == kNMKP) {
    if (((this->mCommDataset).mPresentFlags & 0x800) == 0) {
      GetSteeringData::anon_class_1_0_00000001::operator()(&local_462);
      local_148 = &local_460;
      local_150 = &local_461;
      bVar2 = ::fmt::v10::operator()(local_150);
      local_458 = bVar2.size_;
      local_460 = (v10 *)bVar2.data_;
      ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
      local_270 = &local_450;
      local_280 = local_460;
      sStack_278 = local_458;
      local_e0 = &local_280;
      local_290 = local_460;
      local_288 = local_458;
      local_d8 = local_290;
      sStack_d0 = local_288;
      error = (Error *)::fmt::v10::
                       make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>>();
      local_90 = local_2a0;
      local_98 = &error;
      local_60 = 0;
      fmt_02.size_ = 0;
      fmt_02.data_ = (char *)local_288;
      args_02.field_1.values_ = in_R9.values_;
      args_02.desc_ = (unsigned_long_long)local_98;
      local_88 = local_98;
      local_68 = local_98;
      local_58 = local_90;
      ::fmt::v10::vformat_abi_cxx11_(&local_450,local_290,fmt_02,args_02);
      Error::Error(&local_430,kNotFound,&local_450);
      Error::operator=(__return_storage_ptr__,&local_430);
      Error::~Error(&local_430);
      std::__cxx11::string::~string((string *)&local_450);
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                (pBStack_2d0,&(this->mCommDataset).mNmkpSteeringData);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetSteeringData(ByteArray &aSteeringData, JoinerType aJoinerType) const
{
    Error error;

    VerifyOrExit(IsActive(), error = ERROR_INVALID_STATE("the commissioner is not active"));

    switch (aJoinerType)
    {
    case JoinerType::kMeshCoP:
        VerifyOrExit((mCommDataset.mPresentFlags & CommissionerDataset::kSteeringDataBit),
                     error = ERROR_NOT_FOUND("cannot find Thread 1.1 joiner Steering Data"));
        aSteeringData = mCommDataset.mSteeringData;
        break;

    case JoinerType::kAE:
        VerifyOrExit((mCommDataset.mPresentFlags & CommissionerDataset::kAeSteeringDataBit),
                     error = ERROR_NOT_FOUND("cannot find Thread CCM AE Steering Data"));
        aSteeringData = mCommDataset.mAeSteeringData;
        break;

    case JoinerType::kNMKP:
        VerifyOrExit((mCommDataset.mPresentFlags & CommissionerDataset::kNmkpSteeringDataBit),
                     error = ERROR_NOT_FOUND("cannot find CCM NMKP Steering Data"));
        aSteeringData = mCommDataset.mNmkpSteeringData;
        break;
    }

exit:
    return error;
}